

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absIter.c
# Opt level: O0

Gia_Man_t *
Gia_ManShrinkGla(Gia_Man_t *p,int nFrameMax,int nTimeOut,int fUsePdr,int fUseSat,int fUseBdd,
                int fVerbose)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  abctime aVar4;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar5;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  abctime aVar8;
  bool bVar9;
  int fChanges;
  abctime clkTotal;
  abctime clk;
  Vec_Int_t *vGScopy;
  uint local_40;
  int nRemoved;
  int nTotal;
  int iFrame;
  int iFrame0;
  int i;
  Gia_Obj_t *pObj;
  int fUseBdd_local;
  int fUseSat_local;
  int fUsePdr_local;
  int nTimeOut_local;
  int nFrameMax_local;
  Gia_Man_t *p_local;
  
  local_40 = 0;
  vGScopy._4_4_ = 0;
  aVar4 = Abc_Clock();
  iVar2 = Gia_ManPoNum(p);
  if (iVar2 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                  ,0x4a,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
  }
  if (p->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("p->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                  ,0x4b,"Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
  }
  p_00 = Vec_IntDup(p->vGateClasses);
  if (nFrameMax == 0) {
    nTotal = Gia_IterTryImprove(p,0,0);
  }
  else {
    nTotal = nFrameMax + -1;
  }
  do {
    bVar1 = false;
    iFrame = 1;
    while( true ) {
      bVar9 = false;
      if (iFrame < p->nObjs) {
        _iFrame0 = Gia_ManObj(p,iFrame);
        bVar9 = _iFrame0 != (Gia_Obj_t *)0x0;
      }
      if (!bVar9) break;
      if (((*(ulong *)_iFrame0 >> 0x1e & 1) == 0) &&
         (iVar2 = Gia_ObjIsInGla(p,_iFrame0), iVar2 != 0)) {
        pGVar5 = Gia_ManPo(p,0);
        pGVar5 = Gia_ObjFanin0(pGVar5);
        if (_iFrame0 != pGVar5) {
          iVar2 = Gia_ObjIsAnd(_iFrame0);
          if (iVar2 != 0) {
            pGVar5 = Gia_ObjFanin0(_iFrame0);
            iVar2 = Gia_ObjIsInGla(p,pGVar5);
            if (iVar2 != 0) {
              pGVar5 = Gia_ObjFanin1(_iFrame0);
              iVar2 = Gia_ObjIsInGla(p,pGVar5);
              if (iVar2 != 0) goto LAB_007954c7;
            }
          }
          iVar2 = Gia_ObjIsRo(p,_iFrame0);
          if (iVar2 != 0) {
            pGVar5 = Gia_ObjRoToRi(p,_iFrame0);
            pGVar5 = Gia_ObjFanin0(pGVar5);
            iVar2 = Gia_ObjIsInGla(p,pGVar5);
            if (iVar2 != 0) goto LAB_007954c7;
          }
          aVar8 = Abc_Clock();
          printf("%5d : ",(ulong)local_40);
          printf("Obj =%7d   ",(ulong)(uint)iFrame);
          Gia_ObjRemFromGla(p,_iFrame0);
          uVar3 = Gia_IterTryImprove(p,nTimeOut,nTotal);
          if (nFrameMax == 0) {
            if (nTotal < (int)uVar3) {
              __assert_fail("iFrame <= iFrame0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                            ,0x6e,
                            "Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)"
                           );
            }
          }
          else if (nFrameMax < (int)uVar3) {
            __assert_fail("iFrame <= nFrameMax",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absIter.c"
                          ,0x6c,
                          "Gia_Man_t *Gia_ManShrinkGla(Gia_Man_t *, int, int, int, int, int, int)");
          }
          printf("Frame =%6d   ",(ulong)uVar3);
          if ((int)uVar3 < nTotal) {
            *(ulong *)_iFrame0 = *(ulong *)_iFrame0 & 0xffffffffbfffffff | 0x40000000;
            Gia_ObjAddToGla(p,_iFrame0);
            printf("           ");
          }
          else {
            bVar1 = true;
            vGScopy._4_4_ = vGScopy._4_4_ + 1;
            printf("Removing   ");
            iVar2 = Gia_ObjId(p,_iFrame0);
            Vec_IntWriteEntry(p_00,iVar2,0);
          }
          aVar6 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar6 - aVar8);
          local_40 = local_40 + 1;
          Vec_IntFreeP(&p->vGateClasses);
          pVVar7 = Vec_IntDup(p_00);
          p->vGateClasses = pVVar7;
        }
      }
LAB_007954c7:
      iFrame = iFrame + 1;
    }
    if (!bVar1) {
      Gia_ManCleanMark0(p);
      Vec_IntFree(p_00);
      printf("Tried = %d.  ",(ulong)local_40);
      iVar2 = Vec_IntCountPositive(p->vGateClasses);
      printf("Removed = %d. (%.2f %%)  ",((double)(int)vGScopy._4_4_ * 100.0) / (double)iVar2,
             (ulong)vGScopy._4_4_);
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar8 - aVar4);
      return (Gia_Man_t *)0x0;
    }
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManShrinkGla( Gia_Man_t * p, int nFrameMax, int nTimeOut, int fUsePdr, int fUseSat, int fUseBdd, int fVerbose )
{
    Gia_Obj_t * pObj;
    int i, iFrame0, iFrame;
    int nTotal = 0, nRemoved = 0;
    Vec_Int_t * vGScopy;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManPoNum(p) == 1 );
    assert( p->vGateClasses != NULL );
    vGScopy = Vec_IntDup( p->vGateClasses );
    if ( nFrameMax == 0 )
        iFrame0 = Gia_IterTryImprove( p, 0, 0 );
    else
        iFrame0 = nFrameMax - 1;
    while ( 1 )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( pObj->fMark0 )
                continue;
            if ( !Gia_ObjIsInGla(p, pObj) )
                continue;
            if ( pObj == Gia_ObjFanin0( Gia_ManPo(p, 0) ) )
                continue;
            if ( Gia_ObjIsAnd(pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(pObj)) && Gia_ObjIsInGla(p, Gia_ObjFanin1(pObj)) )
                    continue;
            }
            if ( Gia_ObjIsRo(p, pObj) )
            {
                if ( Gia_ObjIsInGla(p, Gia_ObjFanin0(Gia_ObjRoToRi(p, pObj))) )
                    continue;
            }        
            clk = Abc_Clock();
            printf( "%5d : ", nTotal );
            printf( "Obj =%7d   ", i );
            Gia_ObjRemFromGla( p, pObj );
            iFrame = Gia_IterTryImprove( p, nTimeOut, iFrame0 );
            if ( nFrameMax )
                assert( iFrame <= nFrameMax );
            else
                assert( iFrame <= iFrame0 );
            printf( "Frame =%6d   ", iFrame );
            if ( iFrame < iFrame0 )
            {
                pObj->fMark0 = 1;
                Gia_ObjAddToGla( p, pObj );
                printf( "           " );
            }
            else
            {
                fChanges = 1;
                nRemoved++;
                printf( "Removing   " );
                Vec_IntWriteEntry( vGScopy, Gia_ObjId(p, pObj), 0 );
            }
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            nTotal++;
            // update the classes
            Vec_IntFreeP( &p->vGateClasses );
            p->vGateClasses = Vec_IntDup(vGScopy);
        }
        if ( !fChanges )
            break;
    }
    Gia_ManCleanMark0(p);
    Vec_IntFree( vGScopy );
    printf( "Tried = %d.  ",     nTotal );
    printf( "Removed = %d. (%.2f %%)  ",  nRemoved, 100.0 * nRemoved / Vec_IntCountPositive(p->vGateClasses) );
    Abc_PrintTime( 1, "Time",  Abc_Clock() - clkTotal );
    return NULL;
}